

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notify_bind.c
# Opt level: O0

int socket_conv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  mpt_named_traits *pmVar1;
  mpt_type_t local_40;
  mpt_type_t me;
  mpt_named_traits *traits;
  socketInput *sd;
  void *ptr_local;
  mpt_type_t type_local;
  mpt_convertable *val_local;
  
  pmVar1 = mpt_input_type_traits();
  if (pmVar1 == (mpt_named_traits *)0x0) {
    local_40 = 0x100;
  }
  else {
    local_40 = pmVar1->type;
    if (type == local_40) {
      if (ptr != (void *)0x0) {
        *(mpt_convertable **)ptr = val;
      }
      return 1;
    }
  }
  val_local._4_4_ = (int)local_40;
  if (type == 0) {
    if (ptr != (void *)0x0) {
      *(char **)ptr = "\x01";
    }
  }
  else if (type == 0x100) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val;
    }
    val_local._4_4_ = 1;
  }
  else if (type == 1) {
    if (ptr != (void *)0x0) {
      *(undefined4 *)ptr = *(undefined4 *)&val[1]._vptr;
    }
  }
  else {
    val_local._4_4_ = -3;
  }
  return val_local._4_4_;
}

Assistant:

static int socket_conv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	struct socketInput *sd = (void *) val;
	const MPT_STRUCT(named_traits) *traits = mpt_input_type_traits();
	MPT_TYPE(type) me;
	
	if (!traits) {
		me = MPT_ENUM(TypeMetaPtr);
	}
	else if (type == (me = traits->type)) {
		if (ptr) *((void **) ptr) = &sd->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (!type) {
		static const char fmt[] = { MPT_ENUM(TypeUnixSocket), 0 };
		if (ptr) *((const char **) ptr) = fmt;
		return me;
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (ptr) *((void **) ptr) = &sd->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (type == MPT_ENUM(TypeUnixSocket)) {
		if (ptr) *((MPT_STRUCT(socket) *) ptr) = sd->sock;
		return me;
	}
	return MPT_ERROR(BadType);
}